

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample.c
# Opt level: O0

void dumb_end_resampler_n(int n,DUMB_RESAMPLER *resampler)

{
  int in_EDI;
  
  if (in_EDI == 8) {
    dumb_end_resampler_8((DUMB_RESAMPLER *)0x88c92e);
  }
  else if (in_EDI == 0x10) {
    dumb_end_resampler_16((DUMB_RESAMPLER *)0x88c941);
  }
  else {
    dumb_end_resampler((DUMB_RESAMPLER *)0x88c94d);
  }
  return;
}

Assistant:

void dumb_end_resampler_n(int n, DUMB_RESAMPLER *resampler)
{
	if (n == 8)
		dumb_end_resampler_8(resampler);
	else if (n == 16)
		dumb_end_resampler_16(resampler);
	else
		dumb_end_resampler(resampler);
}